

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O0

void __thiscall CMU462::Application::updateWidgets(Application *this)

{
  Selection *in_RDI;
  XFormWidget *unaff_retaddr;
  Scene *in_stack_00000008;
  
  if (*(long *)((long)in_RDI[1].coordinates.z + 0x30) == 0) {
    DynamicScene::Scene::removeObject(in_stack_00000008,&unaff_retaddr->super_SceneObject);
  }
  else if (*(int *)((long)&in_RDI->element + 4) == 0) {
    if (*(int *)&(in_RDI->coordinates).x == 1) {
      if ((*(long *)((long)in_RDI[1].coordinates.z + 0x30) !=
           *(long *)((long)in_RDI[1].coordinates.z + 0x90)) &&
         (*(long *)((long)in_RDI[1].coordinates.z + 0x38) != 0)) {
        DynamicScene::XFormWidget::setTarget(unaff_retaddr,in_RDI);
      }
    }
    else {
      DynamicScene::Scene::removeObject(in_stack_00000008,&unaff_retaddr->super_SceneObject);
    }
  }
  else if (*(int *)((long)&in_RDI->element + 4) == 2) {
    if (*(int *)&(in_RDI->coordinates).x == 7) {
      if (*(long *)((long)in_RDI[1].coordinates.z + 0x30) !=
          *(long *)((long)in_RDI[1].coordinates.z + 0x90)) {
        DynamicScene::XFormWidget::setTarget(unaff_retaddr,in_RDI);
      }
    }
    else if (((*(int *)&(in_RDI->coordinates).x == 6) &&
             (*(long *)((long)in_RDI[1].coordinates.z + 0x30) !=
              *(long *)((long)in_RDI[1].coordinates.z + 0x90))) &&
            (*(long *)((long)in_RDI[1].coordinates.z + 0x38) != 0)) {
      DynamicScene::XFormWidget::setTarget(unaff_retaddr,in_RDI);
    }
  }
  else {
    DynamicScene::Scene::removeObject(in_stack_00000008,&unaff_retaddr->super_SceneObject);
  }
  return;
}

Assistant:

void Application::updateWidgets() {
  if (scene->selected.object == nullptr) {
    scene->removeObject(scene->elementTransform);
    return;
  }

  if (mode == MODEL_MODE) {
    if (action == Action::Edit) {
      if (scene->selected.object != scene->elementTransform &&
          scene->selected.element != nullptr) {
        scene->elementTransform->setTarget(scene->selected);
      }
    } else {
      scene->removeObject(scene->elementTransform);
      return;
    }
  } else if (mode == ANIMATE_MODE) {
    if (action == Action::Object) {
      if (scene->selected.object != scene->elementTransform) {
        scene->elementTransform->setTarget(scene->selected);
      }
    } else if (action == Action::Wave) {
      if (scene->selected.object != scene->elementTransform &&
          scene->selected.element != nullptr) {
        scene->elementTransform->setTarget(scene->selected);
      }
    }
  } else {
    scene->removeObject(scene->elementTransform);
    return;
  }
}